

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cputlb.c
# Opt level: O3

void tlb_reset_dirty_mips64(CPUState *cpu,ram_addr_t start1,ram_addr_t length)

{
  void *pvVar1;
  long lVar2;
  ulong uVar3;
  long lVar4;
  long lVar5;
  uint uVar6;
  long lVar7;
  
  pvVar1 = cpu->env_ptr;
  lVar4 = (long)pvVar1 + -0xaf8;
  lVar5 = 0;
  do {
    uVar6 = (int)(*(ulong *)((long)pvVar1 + lVar5 * 0x10 + -0x50) >> 6) + 1;
    if (uVar6 != 0) {
      lVar7 = 0;
      do {
        lVar2 = *(long *)((long)pvVar1 + lVar5 * 0x10 + -0x48);
        uVar3 = *(ulong *)(lVar2 + 8 + lVar7);
        if (((uVar3 & 0xe40) == 0) &&
           (((uVar3 & 0xfffffffffffff000) - start1) + *(long *)(lVar2 + 0x20 + lVar7) < length)) {
          *(ulong *)(lVar2 + 8 + lVar7) = uVar3 | 0x400;
        }
        lVar7 = lVar7 + 0x40;
      } while ((ulong)uVar6 << 6 != lVar7);
    }
    lVar7 = 0;
    do {
      uVar3 = *(ulong *)(lVar4 + lVar7);
      if (((uVar3 & 0xe40) == 0) &&
         (((uVar3 & 0xfffffffffffff000) - start1) + *(long *)(lVar4 + 0x18 + lVar7) < length)) {
        *(ulong *)(lVar4 + lVar7) = uVar3 | 0x400;
      }
      lVar7 = lVar7 + 0x40;
    } while (lVar7 != 0x200);
    lVar5 = lVar5 + 1;
    lVar4 = lVar4 + 0x2b8;
  } while (lVar5 != 4);
  return;
}

Assistant:

void tlb_reset_dirty(CPUState *cpu, ram_addr_t start1, ram_addr_t length)
{
    struct uc_struct *uc = cpu->uc;
    CPUArchState *env;

    int mmu_idx;

    env = cpu->env_ptr;
    for (mmu_idx = 0; mmu_idx < NB_MMU_MODES; mmu_idx++) {
        unsigned int i;
        unsigned int n = tlb_n_entries(&env_tlb(env)->f[mmu_idx]);

        for (i = 0; i < n; i++) {
            tlb_reset_dirty_range_locked(uc, &env_tlb(env)->f[mmu_idx].table[i],
                                         start1, length);
        }

        for (i = 0; i < CPU_VTLB_SIZE; i++) {
            tlb_reset_dirty_range_locked(uc, &env_tlb(env)->d[mmu_idx].vtable[i],
                                         start1, length);
        }
    }
}